

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * Cudd_PrioritySelect(DdManager *dd,DdNode *R,DdNode **x,DdNode **y,DdNode **z,DdNode *Pi,
                            int n,DD_PRFP Pifunc)

{
  int *piVar1;
  bool bVar2;
  DdNode *pDVar3;
  DdNode **y_00;
  DdNode *f;
  DdNode *n_00;
  ulong uVar4;
  DdNode *cube;
  ulong uVar5;
  
  y_00 = z;
  if (z == (DdNode **)0x0) {
    if (Pi != (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    y_00 = (DdNode **)malloc((long)n << 3);
    if (y_00 == (DdNode **)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    uVar5 = 0;
    uVar4 = 0;
    if (0 < n) {
      uVar4 = (ulong)(uint)n;
    }
    do {
      if (uVar4 == uVar5) goto LAB_00620151;
      if (0x7ffffffd < dd->size) break;
      pDVar3 = cuddUniqueInter(dd,dd->size,dd->one,(DdNode *)((ulong)dd->one ^ 1));
      y_00[uVar5] = pDVar3;
      uVar5 = uVar5 + 1;
    } while (pDVar3 != (DdNode *)0x0);
    pDVar3 = (DdNode *)0x0;
    Pi = (DdNode *)0x0;
    bVar2 = false;
  }
  else {
LAB_00620151:
    bVar2 = false;
    if (Pi == (DdNode *)0x0) {
      Pi = (*Pifunc)(dd,n,x,y,y_00);
      if (Pi != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)Pi & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        bVar2 = true;
        goto LAB_00620196;
      }
      bVar2 = false;
      Pi = (DdNode *)0x0;
      pDVar3 = (DdNode *)0x0;
    }
    else {
LAB_00620196:
      uVar4 = (ulong)(uint)n;
      cube = dd->one;
      piVar1 = (int *)(((ulong)cube & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      for (; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
        pDVar3 = Cudd_bddAnd(dd,y_00[uVar4 - 1],cube);
        if (pDVar3 == (DdNode *)0x0) goto LAB_00620306;
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,cube);
        cube = pDVar3;
      }
      f = Cudd_bddSwapVariables(dd,R,y,y_00,n);
      if (f == (DdNode *)0x0) {
LAB_00620306:
        pDVar3 = (DdNode *)0x0;
      }
      else {
        piVar1 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        n_00 = Cudd_bddAndAbstract(dd,f,Pi,cube);
        if (n_00 == (DdNode *)0x0) {
          pDVar3 = (DdNode *)0x0;
          n_00 = f;
        }
        else {
          piVar1 = (int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,f);
          pDVar3 = Cudd_bddAnd(dd,R,(DdNode *)((ulong)n_00 ^ 1));
          if (pDVar3 == (DdNode *)0x0) {
            pDVar3 = (DdNode *)0x0;
          }
          else {
            piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        Cudd_RecursiveDeref(dd,n_00);
      }
      if (cube != (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,cube);
      }
    }
    if (z != (DdNode **)0x0) goto LAB_0062035c;
  }
  free(y_00);
LAB_0062035c:
  if (bVar2) {
    Cudd_RecursiveDeref(dd,Pi);
  }
  if (pDVar3 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  return pDVar3;
}

Assistant:

DdNode *
Cudd_PrioritySelect(
  DdManager * dd /* manager */,
  DdNode * R /* BDD of the relation */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables (optional: may be NULL) */,
  DdNode * Pi /* BDD of the priority function (optional: may be NULL) */,
  int  n /* size of x, y, and z */,
  DD_PRFP Pifunc /* function used to build Pi if it is NULL */)
{
    DdNode *res = NULL;
    DdNode *zcube = NULL;
    DdNode *Rxz, *Q;
    int createdZ = 0;
    int createdPi = 0;
    int i;

    /* Create z variables if needed. */
    if (z == NULL) {
        if (Pi != NULL) return(NULL);
        z = ABC_ALLOC(DdNode *,n);
        if (z == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        createdZ = 1;
        for (i = 0; i < n; i++) {
            if (dd->size >= (int) CUDD_MAXINDEX - 1) goto endgame;
            z[i] = cuddUniqueInter(dd,dd->size,dd->one,Cudd_Not(dd->one));
            if (z[i] == NULL) goto endgame;
        }
    }

    /* Create priority function BDD if needed. */
    if (Pi == NULL) {
        Pi = Pifunc(dd,n,x,y,z);
        if (Pi == NULL) goto endgame;
        createdPi = 1;
        cuddRef(Pi);
    }

    /* Initialize abstraction cube. */
    zcube = DD_ONE(dd);
    cuddRef(zcube);
    for (i = n - 1; i >= 0; i--) {
        DdNode *tmpp;
        tmpp = Cudd_bddAnd(dd,z[i],zcube);
        if (tmpp == NULL) goto endgame;
        cuddRef(tmpp);
        Cudd_RecursiveDeref(dd,zcube);
        zcube = tmpp;
    }

    /* Compute subset of (x,y) pairs. */
    Rxz = Cudd_bddSwapVariables(dd,R,y,z,n);
    if (Rxz == NULL) goto endgame;
    cuddRef(Rxz);
    Q = Cudd_bddAndAbstract(dd,Rxz,Pi,zcube);
    if (Q == NULL) {
        Cudd_RecursiveDeref(dd,Rxz);
        goto endgame;
    }
    cuddRef(Q);
    Cudd_RecursiveDeref(dd,Rxz);
    res = Cudd_bddAnd(dd,R,Cudd_Not(Q));
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,Q);
        goto endgame;
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,Q);

endgame:
    if (zcube != NULL) Cudd_RecursiveDeref(dd,zcube);
    if (createdZ) {
        ABC_FREE(z);
    }
    if (createdPi) {
        Cudd_RecursiveDeref(dd,Pi);
    }
    if (res != NULL) cuddDeref(res);
    return(res);

}